

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortstring.c
# Opt level: O0

void input_information(uchar *text,size_t text_len,uchar **strings,size_t strings_len)

{
  int iVar1;
  ulong uVar2;
  char *__s1;
  char *__s2;
  char *vma_info_strings;
  char *vma_info_text;
  size_t input_kb;
  size_t input_mb;
  size_t strings_len_local;
  uchar **strings_local;
  size_t text_len_local;
  uchar *text_local;
  
  uVar2 = text_len >> 10;
  if (text_len >> 0x14 == 0) {
    if (uVar2 == 0) {
      printf("    size: %zu bytes\n",text_len);
    }
    else {
      printf("    size: %zu kB (%zu bytes)\n",uVar2,text_len);
    }
  }
  else {
    printf("    size: %zu MB (%zu kB, %zu bytes)\n",text_len >> 0x14,uVar2,text_len);
  }
  printf("    strings: %zu\n",strings_len);
  puts("");
  __s1 = vma_info(text);
  __s2 = vma_info(strings);
  iVar1 = strcmp(__s1,__s2);
  if (iVar1 == 0) {
    puts("VMA information for text and string pointer arrays:");
    puts(__s1);
  }
  else {
    puts("VMA information for text array:");
    puts(__s1);
    puts("VMA information for string pointer array:");
    puts(__s2);
  }
  free(__s1);
  free(__s2);
  return;
}

Assistant:

static void
input_information(unsigned char *text, size_t text_len,
		unsigned char **strings, size_t strings_len)
{
	size_t input_mb = text_len / (1024*1024);
	size_t input_kb = text_len / 1024;
	if (input_mb)
		printf("    size: %zu MB (%zu kB, %zu bytes)\n",
				input_mb, input_kb, text_len);
	else if (input_kb)
		printf("    size: %zu kB (%zu bytes)\n",
				input_kb, text_len);
	else
		printf("    size: %zu bytes\n", text_len);
	printf("    strings: %zu\n", strings_len);
	puts("");
	char *vma_info_text = vma_info(text);
	char *vma_info_strings = vma_info(strings);
	if (strcmp(vma_info_text, vma_info_strings) == 0) {
		puts("VMA information for text and string pointer arrays:");
		puts(vma_info_text);
	} else {
		puts("VMA information for text array:");
		puts(vma_info_text);
		puts("VMA information for string pointer array:");
		puts(vma_info_strings);
	}
	free(vma_info_text);
	free(vma_info_strings);
}